

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O1

void test_font_get(void)

{
  ostream *poVar1;
  long *plVar2;
  bool is_underline;
  bool is_italic;
  bool is_bold;
  Am_Font_Family_Flag f;
  Am_String font_name;
  Am_Font_Size_Flag s;
  Am_Font lf;
  Am_Font defaultfont;
  undefined1 local_37 [7];
  Am_String local_30;
  int local_24;
  Am_String local_20;
  Am_String local_18;
  
  Am_Font::Am_Font((Am_Font *)&local_18,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  Am_Font::Am_Font((Am_Font *)&local_20,Am_FONT_SERIF,true,false,true,Am_FONT_VERY_LARGE);
  local_30.data = (Am_String_Data *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"For default font, values are: \n",0x1f);
  std::ostream::flush();
  Am_Font::Get(&local_18,(Am_Font_Family_Flag *)&local_30,(bool *)(local_37 + 3),
               (bool *)(local_37 + 2),(bool *)(local_37 + 1),(Am_Font_Size_Flag *)local_37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name ",5);
  poVar1 = (ostream *)operator<<((ostream *)&std::cout,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," family ",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_37._3_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bold ",6);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," italic ",8);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," underline ",0xb);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," size ",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"For font serif,bold,underline,very_large, values are:\n",0x36);
  std::ostream::flush();
  Am_Font::Get(&local_20,(Am_Font_Family_Flag *)&local_30,(bool *)(local_37 + 3),
               (bool *)(local_37 + 2),(bool *)(local_37 + 1),(Am_Font_Size_Flag *)local_37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name ",5);
  poVar1 = (ostream *)operator<<((ostream *)&std::cout,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," family ",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_37._3_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bold ",6);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," italic ",8);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," underline ",0xb);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," size ",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  Am_String::~Am_String(&local_30);
  Am_Font::~Am_Font((Am_Font *)&local_20);
  Am_Font::~Am_Font((Am_Font *)&local_18);
  return;
}

Assistant:

void
test_font_get()
{
  Am_Font defaultfont = Am_Font();
  Am_Font lf(Am_FONT_SERIF, true, false, true, Am_FONT_VERY_LARGE);
  Am_String font_name;
  Am_Font_Family_Flag f;
  bool is_bold;
  bool is_italic;
  bool is_underline;
  Am_Font_Size_Flag s;

  std::cout << "For default font, values are: \n" << std::flush;
  defaultfont.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;

  std::cout << "For font serif,bold,underline,very_large, values are:\n"
            << std::flush;
  lf.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;
}